

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IXSocket.cpp
# Opt level: O0

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
ix::Socket::readBytes_abi_cxx11_
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Socket *this,size_t length,OnProgressCallback *onProgressCallback
          ,CancellationRequest *isCancellationRequested)

{
  bool bVar1;
  int iVar2;
  PollResultType PVar3;
  size_type sVar4;
  unsigned_long *puVar5;
  reference pvVar6;
  undefined4 extraout_var;
  allocator<char> local_151;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_150;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  bool local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  bool local_f1;
  uchar *local_f0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e8;
  uchar *local_e0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d0;
  const_iterator local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  bool local_99;
  long local_98;
  ssize_t ret;
  unsigned_long local_88;
  size_t size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  bool local_55 [13];
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  CancellationRequest *isCancellationRequested_local;
  OnProgressCallback *onProgressCallback_local;
  size_t length_local;
  Socket *this_local;
  
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)isCancellationRequested;
  bVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->_readBuffer);
  if (bVar1) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->_readBuffer,0x8000);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  do {
    sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    if (sVar4 == length) {
      local_119 = true;
      local_148._M_current =
           (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
      local_150._M_current =
           (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((string *)&local_140,local_148,local_150,&local_151);
      ::std::make_pair<bool,std::__cxx11::string>(__return_storage_ptr__,&local_119,&local_140);
      ::std::__cxx11::string::~string((string *)&local_140);
      ::std::allocator<char>::~allocator(&local_151);
      goto LAB_0023c1ba;
    }
    bVar1 = ::std::function::operator_cast_to_bool
                      ((function *)
                       output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((bVar1) &&
       (bVar1 = ::std::function<bool_()>::operator()
                          ((function<bool_()> *)
                           output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)) {
      local_55[0] = false;
      ::std::__cxx11::string::string((string *)&local_78);
      ::std::make_pair<bool,std::__cxx11::string>(__return_storage_ptr__,local_55,&local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
      goto LAB_0023c1ba;
    }
    sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    ret = length - sVar4;
    puVar5 = ::std::min<unsigned_long>(&kChunkSize,(unsigned_long *)&ret);
    local_88 = *puVar5;
    pvVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->_readBuffer,0);
    iVar2 = (*this->_vptr_Socket[6])(this,pvVar6,local_88);
    local_98 = CONCAT44(extraout_var,iVar2);
    if ((local_98 < 1) && (bVar1 = isWaitNeeded(), !bVar1)) {
      local_99 = false;
      ::std::__cxx11::string::string((string *)&local_c0);
      ::std::make_pair<bool,std::__cxx11::string>(__return_storage_ptr__,&local_99,&local_c0);
      ::std::__cxx11::string::~string((string *)&local_c0);
      goto LAB_0023c1ba;
    }
    local_d0._M_current =
         (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_c8,&local_d0);
    local_d8._M_current =
         (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            (&this->_readBuffer);
    local_e8._M_current =
         (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            (&this->_readBuffer);
    local_e0 = (uchar *)__gnu_cxx::
                        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+(&local_e8,local_98);
    local_f0 = (uchar *)::std::vector<unsigned_char,std::allocator<unsigned_char>>::
                        insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_48,
                                   local_c8,local_d8,
                                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    )local_e0);
    bVar1 = ::std::function::operator_cast_to_bool((function *)onProgressCallback);
    if (bVar1) {
      sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
      onProgressCallback_local._0_4_ = (int)length;
      ::std::function<bool_(int,_int)>::operator()
                (onProgressCallback,(int)sVar4,(int)onProgressCallback_local);
    }
    PVar3 = isReadyToRead(this,1);
  } while (PVar3 != Error);
  local_f1 = false;
  ::std::__cxx11::string::string((string *)&local_118);
  ::std::make_pair<bool,std::__cxx11::string>(__return_storage_ptr__,&local_f1,&local_118);
  ::std::__cxx11::string::~string((string *)&local_118);
LAB_0023c1ba:
  size._4_4_ = 1;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> Socket::readBytes(
        size_t length,
        const OnProgressCallback& onProgressCallback,
        const CancellationRequest& isCancellationRequested)
    {
        if (_readBuffer.empty())
        {
            _readBuffer.resize(kChunkSize);
        }

        std::vector<uint8_t> output;
        while (output.size() != length)
        {
            if (isCancellationRequested && isCancellationRequested())
            {
                return std::make_pair(false, std::string());
            }

            size_t size = std::min(kChunkSize, length - output.size());
            ssize_t ret = recv((char*)&_readBuffer[0], size);

            if (ret <= 0 && !Socket::isWaitNeeded())
            {
                // Error
                return std::make_pair(false, std::string());
            }
            else
            {
                output.insert(output.end(),
                              _readBuffer.begin(),
                              _readBuffer.begin() + ret);
            }

            if (onProgressCallback) onProgressCallback((int) output.size(), (int) length);

            // Wait with a 1ms timeout until the socket is ready to read.
            // This way we are not busy looping
            if (isReadyToRead(1) == PollResultType::Error)
            {
                return std::make_pair(false, std::string());
            }
        }

        return std::make_pair(true, std::string(output.begin(),
                                                output.end()));
    }